

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ShadingWriter.cpp
# Opt level: O2

EStatusCode __thiscall
ShadingWriter::WriteAlphaSoftMaskExtGStateObject
          (ShadingWriter *this,PDFRectangle *inBounds,PDFMatrix *inMatrix,
          ObjectIDType inAlphaShadingPatternObjectId,ObjectIDType inExtGStateObjectId)

{
  EStatusCode EVar1;
  IndirectObjectsReferenceRegistry *this_00;
  ObjectIDType inObjectReference;
  DictionaryContext *this_01;
  DictionaryContext *this_02;
  allocator<char> local_59;
  string local_58;
  ObjectIDType local_38;
  
  this_00 = ObjectsContext::GetInDirectObjectsRegistry(this->mObjectsContext);
  inObjectReference = IndirectObjectsReferenceRegistry::AllocateNewObjectID(this_00);
  EVar1 = ObjectsContext::StartNewIndirectObject(this->mObjectsContext,inExtGStateObjectId);
  if (EVar1 == eSuccess) {
    local_38 = inAlphaShadingPatternObjectId;
    this_01 = ObjectsContext::StartDictionary(this->mObjectsContext);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_58,"Type",&local_59);
    DictionaryContext::WriteKey(this_01,&local_58);
    std::__cxx11::string::~string((string *)&local_58);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_58,"ExtGState",&local_59);
    DictionaryContext::WriteNameValue(this_01,&local_58);
    std::__cxx11::string::~string((string *)&local_58);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_58,"SMask",&local_59);
    DictionaryContext::WriteKey(this_01,&local_58);
    std::__cxx11::string::~string((string *)&local_58);
    this_02 = ObjectsContext::StartDictionary(this->mObjectsContext);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_58,"Type",&local_59);
    DictionaryContext::WriteKey(this_02,&local_58);
    std::__cxx11::string::~string((string *)&local_58);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_58,"Mask",&local_59);
    DictionaryContext::WriteNameValue(this_02,&local_58);
    std::__cxx11::string::~string((string *)&local_58);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_58,"S",&local_59);
    DictionaryContext::WriteKey(this_02,&local_58);
    std::__cxx11::string::~string((string *)&local_58);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_58,"Luminosity",&local_59);
    DictionaryContext::WriteNameValue(this_02,&local_58);
    std::__cxx11::string::~string((string *)&local_58);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_58,"G",&local_59);
    DictionaryContext::WriteKey(this_02,&local_58);
    std::__cxx11::string::~string((string *)&local_58);
    DictionaryContext::WriteNewObjectReferenceValue(this_02,inObjectReference);
    EVar1 = ObjectsContext::EndDictionary(this->mObjectsContext,this_02);
    if (EVar1 == eSuccess) {
      EVar1 = ObjectsContext::EndDictionary(this->mObjectsContext,this_01);
      if (EVar1 == eSuccess) {
        ObjectsContext::EndIndirectObject(this->mObjectsContext);
        EVar1 = WriteAlphaSoftMaskXObjectFormObject
                          (this,inBounds,inMatrix,local_38,inObjectReference);
      }
    }
  }
  return EVar1;
}

Assistant:

PDFHummus::EStatusCode ShadingWriter::WriteAlphaSoftMaskExtGStateObject(
    const PDFRectangle& inBounds,
    const PDFMatrix& inMatrix,
    ObjectIDType inAlphaShadingPatternObjectId,
    ObjectIDType inExtGStateObjectId
) {
    EStatusCode status = eSuccess;

    do {
        ObjectIDType smaskFormObjectId = mObjectsContext->GetInDirectObjectsRegistry().AllocateNewObjectID();

        // write ExtGState with soft mask reference
        status = mObjectsContext->StartNewIndirectObject(inExtGStateObjectId);
        if(status != eSuccess)
            break;
        DictionaryContext* extGStateDict = mObjectsContext->StartDictionary();

        extGStateDict->WriteKey("Type");
        extGStateDict->WriteNameValue("ExtGState");
        extGStateDict->WriteKey("SMask");
        DictionaryContext* smaskDict = mObjectsContext->StartDictionary();
        
        smaskDict->WriteKey("Type");
        smaskDict->WriteNameValue("Mask");
        smaskDict->WriteKey("S");
        smaskDict->WriteNameValue("Luminosity");
        smaskDict->WriteKey("G");
        smaskDict->WriteNewObjectReferenceValue(smaskFormObjectId);
        status = mObjectsContext->EndDictionary(smaskDict);
        if(status != eSuccess)
            break;
        status = mObjectsContext->EndDictionary(extGStateDict);
        if(status != eSuccess)
            break;
        mObjectsContext->EndIndirectObject();

        status = WriteAlphaSoftMaskXObjectFormObject(
            inBounds,
            inMatrix,
            inAlphaShadingPatternObjectId,
            smaskFormObjectId  
        );

    } while(false);

    return status;    
}